

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

QWeakPointer<QObject> * __thiscall
QWeakPointer<QObject>::operator=(QWeakPointer<QObject> *this,QWeakPointer<QObject> *other)

{
  Data *pDVar1;
  QObject *pQVar2;
  Data *pDVar3;
  
  pDVar1 = other->d;
  pQVar2 = other->value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + 1;
    UNLOCK();
  }
  pDVar3 = this->d;
  this->d = pDVar1;
  this->value = pQVar2;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
  }
  return this;
}

Assistant:

QWeakPointer &operator=(const QWeakPointer &other) noexcept
    {
        QWeakPointer copy(other);
        swap(copy);
        return *this;
    }